

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O1

int Ivy_FastMapArea_rec(Ivy_Man_t *pAig,Ivy_Obj_t *pObj,Vec_Vec_t *vLuts)

{
  short sVar1;
  uint *puVar2;
  int iVar3;
  long lVar4;
  void **ppvVar5;
  undefined8 *puVar6;
  void *pvVar7;
  int iVar8;
  size_t __size;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  
  lVar11 = *(long *)((long)pAig->pData + 0x10);
  lVar4 = (long)*(int *)((long)pAig->pData + 8) * (long)pObj->Id;
  if (*(char *)(lVar11 + 1 + lVar4) != '\0') {
    return 0;
  }
  pcVar10 = (char *)(lVar11 + lVar4);
  if (*pcVar10 == '\x01') {
    return 0;
  }
  pcVar10[1] = '\x01';
  if (*pcVar10 < '\x01') {
    iVar8 = 1;
  }
  else {
    lVar11 = 0;
    iVar8 = 0;
    do {
      iVar3 = *(int *)(pcVar10 + lVar11 * 4 + 0xc);
      if (((long)iVar3 < 0) || (pAig->vObjs->nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar3 = Ivy_FastMapArea_rec(pAig,(Ivy_Obj_t *)pAig->vObjs->pArray[iVar3],vLuts);
      iVar8 = iVar8 + iVar3;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *pcVar10);
    iVar8 = iVar8 + 1;
  }
  sVar1 = *(short *)(pcVar10 + 8);
  uVar9 = (uint)sVar1;
  if (vLuts->nSize <= (int)uVar9) {
    iVar3 = (int)((long)(int)uVar9 + 1);
    if (vLuts->nCap <= (int)uVar9) {
      __size = ((long)(int)uVar9 + 1) * 8;
      if (vLuts->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(__size);
      }
      else {
        ppvVar5 = (void **)realloc(vLuts->pArray,__size);
      }
      vLuts->pArray = ppvVar5;
      vLuts->nCap = iVar3;
    }
    iVar12 = vLuts->nSize;
    lVar11 = (long)iVar12;
    if (iVar12 <= (int)uVar9) {
      iVar12 = (uVar9 - iVar12) + 1;
      do {
        puVar6 = (undefined8 *)malloc(0x10);
        *puVar6 = 0;
        puVar6[1] = 0;
        vLuts->pArray[lVar11] = puVar6;
        lVar11 = lVar11 + 1;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    vLuts->nSize = iVar3;
  }
  if ((sVar1 < 0) || (vLuts->nSize <= (int)uVar9)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
  }
  puVar2 = (uint *)vLuts->pArray[uVar9];
  uVar9 = *puVar2;
  if (puVar2[1] == uVar9) {
    if ((int)uVar9 < 0x10) {
      if (*(void **)(puVar2 + 2) == (void *)0x0) {
        pvVar7 = malloc(0x80);
      }
      else {
        pvVar7 = realloc(*(void **)(puVar2 + 2),0x80);
      }
      *(void **)(puVar2 + 2) = pvVar7;
      uVar13 = 0x10;
    }
    else {
      uVar13 = uVar9 * 2;
      if ((int)uVar13 <= (int)uVar9) goto LAB_00798c45;
      if (*(void **)(puVar2 + 2) == (void *)0x0) {
        pvVar7 = malloc((ulong)uVar9 << 4);
      }
      else {
        pvVar7 = realloc(*(void **)(puVar2 + 2),(ulong)uVar9 << 4);
      }
      *(void **)(puVar2 + 2) = pvVar7;
    }
    *puVar2 = uVar13;
  }
LAB_00798c45:
  uVar9 = puVar2[1];
  puVar2[1] = uVar9 + 1;
  *(Ivy_Obj_t **)(*(long *)(puVar2 + 2) + (long)(int)uVar9 * 8) = pObj;
  return iVar8;
}

Assistant:

int Ivy_FastMapArea_rec( Ivy_Man_t * pAig, Ivy_Obj_t * pObj, Vec_Vec_t * vLuts )
{
    Ivy_Supp_t * pSupp;
    int i, Counter;
    pSupp = Ivy_ObjSupp( pAig, pObj );
    // skip visited nodes and PIs
    if ( pSupp->fMark || pSupp->nSize == 1 )
        return 0;
    pSupp->fMark = 1;
    // compute the area of this node
    Counter = 0;
    for ( i = 0; i < pSupp->nSize; i++ )
        Counter += Ivy_FastMapArea_rec( pAig, Ivy_ManObj(pAig, pSupp->pArray[i]), vLuts );
    // add the node to the array of LUTs
    Vec_VecPush( vLuts, pSupp->Delay, pObj );
    return 1 + Counter;
}